

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void intgemm::anon_unknown_0::RunAll<intgemm::AVX2::Kernels16>
               (RandomMatrices *matrices,RandomMatrices *matrices_end,
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *stats)

{
  ulong uVar1;
  size_type sVar2;
  reference __x;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RDX;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *this;
  size_t i;
  size_t size;
  RandomMatrices *in_stack_000000b0;
  undefined8 local_28;
  
  if (2 < kCPU) {
    uVar1 = ((long)in_RSI - in_RDI) / 0x30;
    sVar2 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(in_RDX);
    if (sVar2 < uVar1) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(in_RSI,(size_type)in_RDX);
    }
    for (local_28 = 0; local_28 < uVar1; local_28 = local_28 + 1) {
      __x = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::operator[](in_RDX,local_28);
      this = (vector<double,_std::allocator<double>_> *)
             Run<intgemm::AVX2::Kernels16>(in_stack_000000b0);
      std::vector<double,_std::allocator<double>_>::push_back(this,(value_type *)__x);
    }
  }
  return;
}

Assistant:

void RunAll(RandomMatrices *matrices, RandomMatrices *matrices_end, std::vector<std::vector<double>> &stats) {
  if (Backend::kUses > kCPU) return;
  std::size_t size = matrices_end - matrices;
  if (stats.size() < size)
    stats.resize(size);
  for (std::size_t i = 0; i < size; ++i) {
    stats[i].push_back(Run<Backend>(matrices[i]));
  }
}